

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ResolveSelfReference(Parse *pParse,Table *pTab,int type,Expr *pExpr,ExprList *pList)

{
  int local_ec;
  undefined1 auStack_e8 [4];
  int rc;
  NameContext sNC;
  SrcList sSrc;
  ExprList *pList_local;
  Expr *pExpr_local;
  int type_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  memset(auStack_e8,0,0x38);
  memset(&sNC.pWinSelect,0,0x78);
  if (pTab != (Table *)0x0) {
    sNC.pWinSelect._0_4_ = 1;
  }
  sNC.pParse = (Parse *)&sNC.pWinSelect;
  sNC.nRef._0_2_ = (undefined2)type;
  _auStack_e8 = pParse;
  local_ec = sqlite3ResolveExprNames((NameContext *)auStack_e8,pExpr);
  pParse_local._4_4_ = local_ec;
  if (local_ec == 0) {
    if (pList != (ExprList *)0x0) {
      local_ec = sqlite3ResolveExprListNames((NameContext *)auStack_e8,pList);
    }
    pParse_local._4_4_ = local_ec;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveSelfReference(
  Parse *pParse,      /* Parsing context */
  Table *pTab,        /* The table being referenced, or NULL */
  int type,           /* NC_IsCheck or NC_PartIdx or NC_IdxExpr, or 0 */
  Expr *pExpr,        /* Expression to resolve.  May be NULL. */
  ExprList *pList     /* Expression list to resolve.  May be NULL. */
){
  SrcList sSrc;                   /* Fake SrcList for pParse->pNewTable */
  NameContext sNC;                /* Name context for pParse->pNewTable */
  int rc;

  assert( type==0 || pTab!=0 );
  assert( type==NC_IsCheck || type==NC_PartIdx || type==NC_IdxExpr || pTab==0 );
  memset(&sNC, 0, sizeof(sNC));
  memset(&sSrc, 0, sizeof(sSrc));
  if( pTab ){
    sSrc.nSrc = 1;
    sSrc.a[0].zName = pTab->zName;
    sSrc.a[0].pTab = pTab;
    sSrc.a[0].iCursor = -1;
  }
  sNC.pParse = pParse;
  sNC.pSrcList = &sSrc;
  sNC.ncFlags = type;
  if( (rc = sqlite3ResolveExprNames(&sNC, pExpr))!=SQLITE_OK ) return rc;
  if( pList ) rc = sqlite3ResolveExprListNames(&sNC, pList);
  return rc;
}